

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

int inferred_mb_field_decoding_flag(h264_slice *slice)

{
  h264_macroblock *phVar1;
  h264_macroblock *phVar2;
  uint32_t uVar3;
  
  if (slice->mbaff_frame_flag == 0) {
    uVar3 = slice->field_pic_flag;
  }
  else {
    uVar3 = 0;
    phVar1 = h264_mb_nb_p(slice,H264_MB_A,0);
    phVar2 = h264_mb_nb_p(slice,H264_MB_B,0);
    if (phVar1->mb_type == 0x39) {
      if (phVar2->mb_type != 0x39) {
        uVar3 = phVar2->mb_field_decoding_flag;
      }
    }
    else {
      uVar3 = phVar1->mb_field_decoding_flag;
    }
  }
  return uVar3;
}

Assistant:

static int inferred_mb_field_decoding_flag(struct h264_slice *slice) {
	if (slice->mbaff_frame_flag) {
		const struct h264_macroblock *mbA = h264_mb_nb_p(slice, H264_MB_A, 0);
		const struct h264_macroblock *mbB = h264_mb_nb_p(slice, H264_MB_B, 0);
		if (mbA->mb_type != H264_MB_TYPE_UNAVAIL) {
			return mbA->mb_field_decoding_flag;
		} else if (mbB->mb_type != H264_MB_TYPE_UNAVAIL) {
			return mbB->mb_field_decoding_flag;
		} else {
			return 0;
		}
	} else {
		return slice->field_pic_flag;
	}
}